

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

string * __thiscall
skiwi::(anonymous_namespace)::uint64_to_hex_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint64_t i)

{
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  string local_58;
  int local_38;
  int j;
  allocator<char> local_22;
  undefined1 local_21;
  uchar **local_20;
  uchar *ptr;
  uint64_t i_local;
  string *out;
  
  local_20 = &ptr;
  local_21 = 0;
  ptr = (uchar *)this;
  i_local = (uint64_t)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"0x",&local_22);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = extraout_RDX;
  for (local_38 = 7; -1 < local_38; local_38 = local_38 + -1) {
    uchar_to_hex_abi_cxx11_
              (&local_58,(_anonymous_namespace_ *)(ulong)*(byte *)((long)local_20 + (long)local_38),
               (uchar)uVar1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    uVar1 = extraout_RDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string uint64_to_hex(uint64_t i)
    {
    unsigned char* ptr = (unsigned char*)&i;
    std::string out = "0x";
    for (int j = 7; j >= 0; --j)
      out += uchar_to_hex(ptr[j]);
    return out;
    }